

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_prismatic_spray(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  AFFECT_DATA af;
  
  iVar4 = number_range(1,7);
  iVar5 = 0;
  act("You send a diffuse spray of varicolored light streaking towards $N!",ch,(void *)0x0,vo,3);
  act("$n sends a diffuse spray of varicolored light streaking towards you!",ch,(void *)0x0,vo,2);
  act("$n sends a diffuse spray of varicolored light streaking towards $N!",ch,(void *)0x0,vo,1);
  switch(iVar4) {
  case 1:
    act("A red beam of light strikes $n!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    act("A red beam of light strikes you!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    iVar5 = dice(level,2);
    bVar3 = saves_spell(level,(CHAR_DATA *)vo,0xf);
    if (!bVar3) {
      bVar2 = false;
      bVar1 = false;
      bVar3 = false;
      goto LAB_0036325b;
    }
    goto LAB_0036314d;
  case 2:
    act("An orange beam of light strikes $n!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    act("An orange beam of light strikes you!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    iVar5 = 4;
    goto LAB_00363123;
  case 3:
    act("A yellow beam of light strikes $n!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    act("A yellow beam of light strikes you!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    iVar5 = 7;
LAB_00363123:
    iVar5 = dice(level,iVar5);
    bVar3 = saves_spell(level,(CHAR_DATA *)vo,0xf);
    if (bVar3) {
LAB_0036314d:
      iVar5 = iVar5 / 2;
      bVar3 = false;
      bVar2 = false;
      bVar1 = false;
      goto LAB_0036325b;
    }
    break;
  case 4:
    bVar2 = false;
    act("A green beam of light strikes $n!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    act("A green beam of light strikes you!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    iVar4 = dice(level,3);
    bVar3 = saves_spell(level,(CHAR_DATA *)vo,0xf);
    iVar5 = iVar4 / 2;
    if (!bVar3) {
      iVar5 = iVar4;
    }
    bVar3 = saves_spell(level,(CHAR_DATA *)vo,8);
    bVar3 = !bVar3;
    goto LAB_00363258;
  case 5:
    act("A blue beam of light strikes $n!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    act("A blue beam of light strikes you!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    iVar4 = dice(level,3);
    bVar3 = saves_spell(level,(CHAR_DATA *)vo,0xf);
    iVar5 = iVar4 / 2;
    if (!bVar3) {
      iVar5 = iVar4;
    }
    LAG_CHAR((CHAR_DATA *)vo,0x18);
    break;
  case 6:
    bVar3 = false;
    act("A indigo beam of light strikes $n!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    act("A indigo beam of light strikes you!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    iVar4 = dice(level,3);
    bVar2 = saves_spell(level,(CHAR_DATA *)vo,0xf);
    iVar5 = iVar4 / 2;
    if (!bVar2) {
      iVar5 = iVar4;
    }
    bVar1 = saves_spell(level,(CHAR_DATA *)vo,0x11);
    bVar2 = false;
    goto LAB_0036325b;
  case 7:
    bVar3 = false;
    act("A violet beam of light strikes $n!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    act("A violet beam of light strikes you!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    iVar5 = dice(level,3);
    bVar2 = saves_spell(level,(CHAR_DATA *)vo,0x14);
    bVar2 = !bVar2;
    goto LAB_00363258;
  }
  bVar3 = false;
  bVar2 = false;
LAB_00363258:
  bVar1 = false;
LAB_0036325b:
  damage_new(ch,(CHAR_DATA *)vo,iVar5,sn,0xf,true,false,0,1,"prismatic spray");
  if ((bVar3) && (bVar3 = is_affected((CHAR_DATA *)vo,(int)gsn_poison), !bVar3)) {
    act("Poison creeps into your veins as the sickly light washes over you.",(CHAR_DATA *)vo,
        (void *)0x0,(void *)0x0,3);
    act("$n looks very ill.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    init_affect(&af);
    af.where = 0;
    af.type = gsn_poison;
    af.aftype = 3;
    af.location = 1;
    af.modifier = -5;
    af.duration = (short)(level / 4);
    af.bitvector[0]._1_1_ = af.bitvector[0]._1_1_ | 0x10;
    af.tick_fun = poison_tick;
    af.end_fun = (AFF_FUN *)0x0;
    af.owner = ch;
    af.level = (short)level;
    affect_to_char((CHAR_DATA *)vo,&af);
  }
  if (bVar1 != false) {
    act("The intense indigo light sears your eyes, blinding you!",(CHAR_DATA *)vo,(void *)0x0,
        (void *)0x0,3);
    act("$n appears to be blinded.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    init_affect(&af);
    af.where = 0;
    af.type = gsn_blindness;
    af.aftype = 0;
    af.location = 0x12;
    af.modifier = -4;
    af.duration = (short)(level / 6);
    af.bitvector[0]._0_1_ = (byte)af.bitvector[0] | 1;
    af.tick_fun = (AFF_FUN *)0x0;
    af.end_fun = (AFF_FUN *)0x0;
    af.owner = ch;
    af.level = (short)level;
    affect_to_char((CHAR_DATA *)vo,&af);
  }
  if (bVar2) {
    act("You feel a piercing pain in your chest as the violet light washes over you!",
        (CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    act("$n writhes in agony as the violet light passes through $m!",(CHAR_DATA *)vo,(void *)0x0,
        (void *)0x0,0);
    if ((int)*(short *)((long)vo + 0x138) < ch->level + -9) {
      act("You gasp in horror as your body disintegrates into nothingness.",(CHAR_DATA *)vo,
          (void *)0x0,(void *)0x0,3);
      act("A final look of horror crosses $n\'s face before $e disintegrates into dust.",
          (CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
      raw_kill(ch,(CHAR_DATA *)vo);
    }
    else {
      iVar5 = dice(level,9);
      damage_new(ch,(CHAR_DATA *)vo,iVar5,sn,0x14,true,false,0,1,"disintegration");
    }
  }
  return;
}

Assistant:

void spell_prismatic_spray(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	int color = number_range(1, 7), dam = 0;
	bool poisoned = false, disint = false, blinded = false;

	act("You send a diffuse spray of varicolored light streaking towards $N!", ch, 0, victim, TO_CHAR);
	act("$n sends a diffuse spray of varicolored light streaking towards you!", ch, 0, victim, TO_VICT);
	act("$n sends a diffuse spray of varicolored light streaking towards $N!", ch, 0, victim, TO_NOTVICT);

	switch (color)
	{
		case 1:
			act("A red beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A red beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 2);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			break;
		case 2:
			act("An orange beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("An orange beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 4);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			break;
		case 3:
			act("A yellow beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A yellow beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 7);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			break;
		case 4:
			act("A green beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A green beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 3);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			if (!saves_spell(level, victim, DAM_POISON))
				poisoned = true;

			break;
		case 5:
			act("A blue beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A blue beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 3);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
			break;
		case 6:
			act("A indigo beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A indigo beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 3);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			if (saves_spell(level, victim, DAM_CHARM))
				blinded = true;

			break;
		case 7:
			act("A violet beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A violet beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 3);

			if (!saves_spell(level, victim, DAM_INTERNAL))
				disint = true;

			break;
	}

	damage_new(ch, victim, dam, sn, DAM_LIGHT, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "prismatic spray");

	if (poisoned && !is_affected(victim, gsn_poison))
	{
		act("Poison creeps into your veins as the sickly light washes over you.", victim, 0, 0, TO_CHAR);
		act("$n looks very ill.", victim, 0, 0, TO_ROOM);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_poison;
		af.aftype = AFT_MALADY;
		af.owner = ch;
		af.level = level;
		af.location = APPLY_STR;
		af.modifier = -5;
		af.duration = level / 4;

		SET_BIT(af.bitvector, AFF_POISON);

		af.tick_fun = poison_tick;
		af.end_fun = nullptr;
		affect_to_char(victim, &af);
	}

	if (blinded)
	{
		act("The intense indigo light sears your eyes, blinding you!", victim, 0, 0, TO_CHAR);
		act("$n appears to be blinded.", victim, 0, 0, TO_ROOM);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_blindness;
		af.aftype = AFT_SPELL;
		af.owner = ch;
		af.level = level;
		af.location = APPLY_HITROLL;
		af.modifier = -4;
		af.duration = level / 6;

		SET_BIT(af.bitvector, AFF_BLIND);

		af.tick_fun = nullptr;
		af.end_fun = nullptr;
		affect_to_char(victim, &af);
	}

	if (disint)
	{
		act("You feel a piercing pain in your chest as the violet light washes over you!", victim, 0, 0, TO_CHAR);
		act("$n writhes in agony as the violet light passes through $m!", victim, 0, 0, TO_ROOM);

		if (victim->level < ch->level - 9)
		{
			act("You gasp in horror as your body disintegrates into nothingness.", victim, 0, 0, TO_CHAR);
			act("A final look of horror crosses $n's face before $e disintegrates into dust.", victim, 0, 0, TO_ROOM);
			raw_kill(ch, victim);
		}
		else
		{
			damage_new(ch, victim, dice(level, 9), sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "disintegration");
		}
	}
}